

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_kurtosis_weighted<float,int,long_double>
                 (size_t col_num,size_t nrows,float *Xc,int *Xc_ind,int *Xc_indptr,
                 MissingAction missing_action,float *w)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int ix;
  long lVar4;
  int ix_1;
  long lVar5;
  long lVar6;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble in_ST1;
  longdouble lVar10;
  longdouble in_ST2;
  longdouble lVar11;
  longdouble lVar12;
  longdouble local_e8;
  longdouble local_c4;
  longdouble local_b8;
  longdouble local_ac;
  long local_78;
  ushort uStack_70;
  long local_68;
  ushort uStack_60;
  
  iVar1 = Xc_indptr[col_num];
  lVar5 = (long)iVar1;
  iVar2 = Xc_indptr[col_num + 1];
  lVar6 = (long)iVar2;
  if (iVar2 != iVar1) {
    lVar4 = nrows - (long)(iVar2 - iVar1);
    local_c4 = (longdouble)lVar4 + (longdouble)(float)(&DAT_003250d8)[lVar4 < 0];
    for (lVar4 = lVar5; lVar4 < lVar6; lVar4 = lVar4 + 1) {
      local_c4 = local_c4 + (longdouble)w[Xc_ind[lVar4]];
    }
    local_b8 = (longdouble)0;
    if (local_b8 < local_c4) {
      lVar10 = local_b8;
      local_e8 = local_b8;
      local_ac = local_b8;
      if (missing_action == Fail) {
        lVar10 = (longdouble)0;
        lVar7 = in_ST2;
        local_e8 = lVar10;
        local_b8 = lVar10;
        local_ac = lVar10;
        for (; lVar8 = in_ST2, lVar11 = in_ST1, lVar9 = in_ST0, lVar5 < lVar6; lVar5 = lVar5 + 1) {
          lVar10 = lVar7;
          in_ST1 = lVar7;
          in_ST2 = lVar7;
          lVar12 = lVar7;
          fmal();
          fmal();
          fmal();
          fmal();
          in_ST0 = lVar7;
          lVar7 = lVar12;
          local_e8 = lVar11;
          local_b8 = lVar9;
          local_ac = lVar8;
        }
      }
      else {
        for (; lVar5 < lVar6; lVar5 = lVar5 + 1) {
          lVar7 = (longdouble)Xc[lVar5];
          local_68 = SUB108(lVar7,0);
          uStack_60 = (ushort)((unkuint10)lVar7 >> 0x40);
          lVar7 = in_ST2;
          if ((NAN(Xc[lVar5])) || ((~uStack_60 & 0x7fff) == 0 && local_68 == -0x8000000000000000)) {
            local_c4 = local_c4 - (longdouble)w[Xc_ind[lVar5]];
            lVar9 = in_ST1;
          }
          else {
            lVar10 = in_ST2;
            lVar11 = in_ST2;
            lVar9 = in_ST2;
            fmal();
            fmal();
            fmal();
            fmal();
            local_b8 = in_ST0;
            in_ST0 = lVar11;
            local_e8 = in_ST1;
            local_ac = in_ST2;
          }
          in_ST1 = lVar9;
          in_ST2 = lVar7;
        }
        if (local_c4 <= (longdouble)0) {
          return -INFINITY;
        }
      }
      if ((longdouble)1 < local_c4) {
        if ((local_e8 != (longdouble)0) || (NAN(local_e8) || NAN((longdouble)0))) {
          if ((local_e8 != local_b8 * local_b8) || (NAN(local_e8) || NAN(local_b8 * local_b8))) {
            lVar7 = local_b8 / local_c4;
            lVar9 = lVar7 * lVar7;
            lVar11 = local_e8 / local_c4 - lVar9;
            if ((!NAN(lVar11)) &&
               (((longdouble)2.220446e-16 < lVar11 ||
                ((bVar3 = check_more_than_two_unique_values<float,int>
                                    (nrows,col_num,Xc_indptr,Xc_ind,Xc,missing_action),
                 (longdouble)0 < lVar11 && (bVar3)))))) {
              lVar10 = (lVar7 * lVar9 * lVar7 * local_c4 +
                       local_b8 * (longdouble)-4.0 * lVar9 * lVar7 +
                       local_e8 * (longdouble)6.0 * lVar9 +
                       local_ac * (longdouble)-4.0 * lVar7 + lVar10) / (lVar11 * lVar11 * local_c4);
              uStack_70 = (ushort)((unkuint10)lVar10 >> 0x40);
              local_78 = SUB108(lVar10,0);
              if (((unkuint10)lVar10 & 0x7fff) == 0 ||
                  (ushort)((uStack_70 & 0x7fff) - 1) < 0x7ffe && local_78 < 0) {
                if ((double)lVar10 <= 0.0) {
                  return 0.0;
                }
                return (double)lVar10;
              }
            }
          }
        }
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t col_num, size_t nrows,
                              real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, real_t *restrict w)
{
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = nrows - (Xc_indptr[col_num + 1] - Xc_indptr[col_num]);
    for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        cnt += w[Xc_ind[ix]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        {
            w_this = w[Xc_ind[ix]];
            xval = Xc[ix];

            if (unlikely(is_na_or_inf(xval)))
            {
                cnt -= w_this;
            }

            else
            {
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);
            }
        }

        if (cnt <= 0) return -HUGE_VAL;
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        {
            w_this = w[Xc_ind[ix]];
            xval = Xc[ix];

            x_sq = xval * xval;
            s1 = std::fma(w_this, xval, s1);
            s2 = std::fma(w_this, x_sq, s2);
            s3 = std::fma(w_this, x_sq*xval, s3);
            s4 = std::fma(w_this, x_sq*x_sq, s4);
            // s1 += w_this * pw1(xval);
            // s2 += w_this * pw2(xval);
            // s3 += w_this * pw3(xval);
            // s4 += w_this * pw4(xval);
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(nrows, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return -HUGE_VAL;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}